

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
* kratos::get_state_color
            (map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
             *__return_storage_ptr__,
            vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *states)

{
  result_type_conflict rVar1;
  FSM *__args;
  bool bVar2;
  Color CVar3;
  mapped_type *__args_1;
  FSM *local_1478;
  FSM *fsm_1;
  FSMState **state_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *__range1_1;
  Color local_143b;
  double dStack_1438;
  Color color;
  double h;
  _Self local_1428;
  FSM *local_1420;
  FSM *fsm;
  FSMState **state;
  const_iterator __end1;
  const_iterator __begin1;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *__range1;
  uniform_real_distribution<double> dis;
  undefined1 local_13d8 [8];
  mt19937 gen;
  map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
  state_color;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *states_local;
  map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
  *result;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
  ::map(__return_storage_ptr__);
  std::
  map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
  ::map((map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
         *)&gen._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_13d8,1);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&__range1,0.0,1.0);
  __end1 = std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::begin(states);
  state = (FSMState **)
          std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::end(states);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<kratos::FSMState_*const_*,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                                     *)&state), bVar2) {
    fsm = (FSM *)__gnu_cxx::
                 __normal_iterator<kratos::FSMState_*const_*,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                 ::operator*(&__end1);
    local_1420 = FSMState::parent(*(FSMState **)&fsm->fsm_name_);
    local_1428._M_node =
         (_Base_ptr)
         std::
         map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
         ::find((map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
                 *)&gen._M_p,&local_1420);
    h = (double)std::
                map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
                ::end((map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
                       *)&gen._M_p);
    bVar2 = std::operator==(&local_1428,(_Self *)&h);
    if (bVar2) {
      rVar1 = std::uniform_real_distribution<double>::operator()
                        ((uniform_real_distribution<double> *)&__range1,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_13d8);
      dStack_1438 = rVar1 + 0.618033988749895;
      dStack_1438 = fmod(dStack_1438,1.0);
      CVar3 = kratos::color::hsv_to_rgb(dStack_1438,0.5,0.95);
      local_143b._0_2_ = CVar3._0_2_;
      local_143b.B = CVar3.B;
      std::
      map<kratos::FSM_const*,kratos::color::Color,std::less<kratos::FSM_const*>,std::allocator<std::pair<kratos::FSM_const*const,kratos::color::Color>>>
      ::emplace<kratos::FSM_const*&,kratos::color::Color&>
                ((map<kratos::FSM_const*,kratos::color::Color,std::less<kratos::FSM_const*>,std::allocator<std::pair<kratos::FSM_const*const,kratos::color::Color>>>
                  *)&gen._M_p,&local_1420,&local_143b);
    }
    __gnu_cxx::
    __normal_iterator<kratos::FSMState_*const_*,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::begin(states);
  state_1 = (FSMState **)
            std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::end(states);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<kratos::FSMState_*const_*,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                             *)&state_1), bVar2) {
    fsm_1 = (FSM *)__gnu_cxx::
                   __normal_iterator<kratos::FSMState_*const_*,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                   ::operator*(&__end1_1);
    local_1478 = FSMState::parent(*(FSMState **)&fsm_1->fsm_name_);
    __args = fsm_1;
    __args_1 = std::
               map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
               ::at((map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
                     *)&gen._M_p,&local_1478);
    std::
    map<kratos::FSMState*,kratos::color::Color,std::less<kratos::FSMState*>,std::allocator<std::pair<kratos::FSMState*const,kratos::color::Color>>>
    ::emplace<kratos::FSMState*const&,kratos::color::Color&>
              ((map<kratos::FSMState*,kratos::color::Color,std::less<kratos::FSMState*>,std::allocator<std::pair<kratos::FSMState*const,kratos::color::Color>>>
                *)__return_storage_ptr__,(FSMState **)__args,__args_1);
    __gnu_cxx::
    __normal_iterator<kratos::FSMState_*const_*,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
    ::operator++(&__end1_1);
  }
  std::
  map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
  ::~map((map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
          *)&gen._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::map<FSMState*, color::Color> get_state_color(const std::vector<FSMState*>& states) {
    std::map<FSMState*, color::Color> result = {};
    std::map<const FSM*, color::Color> state_color;
    // set seed to 0
    std::mt19937 gen(1);  // NOLINT
    std::uniform_real_distribution<double> dis(0, 1.0);
    for (auto const& state : states) {
        auto const* fsm = state->parent();
        if (state_color.find(fsm) == state_color.end()) {
            // get a new color
            double h = dis(gen);
            // use golden ratio
            // https://martin.ankerl.com/2009/12/09/how-to-create-random-colors-programmatically/
            h += 0.618033988749895;
            h = std::fmod(h, 1.0);
            auto color = color::hsv_to_rgb(h, 0.5, 0.95);
            state_color.emplace(fsm, color);
        }
    }

    // second pass the assign colors
    for (const auto& state : states) {
        const auto* fsm = state->parent();
        result.emplace(state, state_color.at(fsm));
    }

    return result;
}